

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::UnknownField::SerializeLengthDelimitedNoTagToArray
          (UnknownField *this,uint8 *target)

{
  string *str;
  Type TVar1;
  uint32 value;
  LogMessage *other;
  uint8 *puVar2;
  string *data;
  byte local_51;
  LogMessage local_50;
  uint8 *local_18;
  uint8 *target_local;
  UnknownField *this_local;
  
  local_18 = target;
  target_local = (uint8 *)this;
  TVar1 = type(this);
  local_51 = 0;
  if (TVar1 != TYPE_LENGTH_DELIMITED) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x14c);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type()): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&data + 3),other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  str = (string *)(this->data_).group_;
  value = std::__cxx11::string::size();
  local_18 = io::CodedOutputStream::WriteVarint32ToArray(value,local_18);
  puVar2 = io::CodedOutputStream::WriteStringToArray(str,local_18);
  return puVar2;
}

Assistant:

uint8* UnknownField::SerializeLengthDelimitedNoTagToArray(uint8* target) const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const string& data = *data_.length_delimited_.string_value_;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = io::CodedOutputStream::WriteStringToArray(data, target);
  return target;
}